

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecimalQuantity::readDecNumberToBcd(DecimalQuantity *this,DecNum *decnum)

{
  int capacity;
  decNumber *pdVar1;
  long lVar2;
  uint8_t *puVar3;
  int8_t *piVar4;
  
  pdVar1 = (decnum->fData).ptr;
  capacity = pdVar1->digits;
  if ((long)capacity < 0x11) {
    if (capacity < 1) {
      piVar4 = (int8_t *)0x0;
    }
    else {
      puVar3 = pdVar1->lsu;
      lVar2 = 0;
      piVar4 = (int8_t *)0x0;
      do {
        piVar4 = (int8_t *)((ulong)piVar4 | (ulong)*puVar3 << ((byte)lVar2 & 0x3f));
        puVar3 = puVar3 + 1;
        lVar2 = lVar2 + 4;
      } while ((long)capacity * 4 != lVar2);
    }
    (this->fBCD).bcdBytes.ptr = piVar4;
  }
  else {
    ensureCapacity(this,capacity);
    if (0 < pdVar1->digits) {
      lVar2 = 0;
      do {
        (this->fBCD).bcdBytes.ptr[lVar2] = pdVar1->lsu[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 < pdVar1->digits);
    }
  }
  this->scale = pdVar1->exponent;
  this->precision = pdVar1->digits;
  return;
}

Assistant:

void DecimalQuantity::readDecNumberToBcd(const DecNum& decnum) {
    const decNumber* dn = decnum.getRawDecNumber();
    if (dn->digits > 16) {
        ensureCapacity(dn->digits);
        for (int32_t i = 0; i < dn->digits; i++) {
            fBCD.bcdBytes.ptr[i] = dn->lsu[i];
        }
    } else {
        uint64_t result = 0L;
        for (int32_t i = 0; i < dn->digits; i++) {
            result |= static_cast<uint64_t>(dn->lsu[i]) << (4 * i);
        }
        fBCD.bcdLong = result;
    }
    scale = dn->exponent;
    precision = dn->digits;
}